

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtBox2dBox2dCollisionAlgorithm.cpp
# Opt level: O3

void b2CollidePolygons(cbtManifoldResult *manifold,cbtBox2dShape *polyA,cbtTransform *xfA,
                      cbtBox2dShape *polyB,cbtTransform *xfB)

{
  cbtVector3 *pcVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  cbtScalar cVar5;
  cbtScalar cVar6;
  float fVar7;
  cbtScalar cVar8;
  cbtScalar cVar9;
  float fVar10;
  cbtScalar cVar11;
  float fVar12;
  cbtScalar cVar13;
  float fVar14;
  float fVar15;
  cbtScalar cVar16;
  cbtScalar cVar17;
  cbtScalar cVar18;
  cbtScalar cVar19;
  cbtScalar cVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  cbtScalar cVar24;
  cbtScalar cVar25;
  cbtScalar cVar26;
  float fVar27;
  undefined8 uVar28;
  cbtTransform *pcVar29;
  int *piVar30;
  cbtManifoldResult *pcVar31;
  int iVar32;
  ulong uVar33;
  ulong uVar34;
  int iVar35;
  cbtScalar *pcVar36;
  ulong uVar37;
  long lVar38;
  cbtBox2dShape *pcVar39;
  cbtVector3 *pcVar40;
  ClipVertex *vOut;
  bool bVar41;
  bool bVar42;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  cbtScalar cVar49;
  cbtScalar cVar50;
  undefined1 auVar51 [16];
  float fVar52;
  undefined1 auVar53 [16];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  float fVar56;
  undefined1 auVar57 [64];
  int edgeB;
  int edgeA;
  ClipVertex incidentEdge [2];
  cbtVector3 local_148;
  cbtScalar local_138 [4];
  undefined1 local_128 [16];
  cbtManifoldResult *local_118;
  int local_110 [2];
  cbtVector3 local_108;
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  ClipVertex local_b8;
  undefined8 local_a4;
  undefined8 uStack_9c;
  ClipVertex local_88;
  undefined8 local_74;
  undefined8 uStack_6c;
  ClipVertex local_58;
  undefined1 local_44 [16];
  
  local_110[1] = 0;
  cVar49 = FindMaxSeparation(local_110 + 1,polyA,xfA,polyB,xfB);
  if (cVar49 <= 0.0) {
    local_110[0] = 0;
    local_118 = manifold;
    cVar50 = FindMaxSeparation(local_110,polyB,xfB,polyA,xfA);
    if (cVar50 <= 0.0) {
      auVar43 = vfmadd213ss_fma(SUB6416(ZEXT464(0x3f7ae148),0),ZEXT416((uint)cVar49),
                                ZEXT416(0x3a83126f));
      fVar52 = auVar43._0_4_;
      pcVar39 = polyB;
      pcVar29 = xfB;
      piVar30 = local_110;
      if (cVar50 <= fVar52) {
        pcVar39 = polyA;
        pcVar29 = xfA;
        xfA = xfB;
        piVar30 = local_110 + 1;
        polyA = polyB;
      }
      uVar37 = 0;
      uVar34 = 0;
      fVar2 = (xfA->m_origin).m_floats[2];
      fVar56 = (xfA->m_origin).m_floats[1];
      fVar3 = (xfA->m_origin).m_floats[0];
      cVar49 = (xfA->m_basis).m_el[0].m_floats[0];
      fVar4 = (xfA->m_basis).m_el[0].m_floats[1];
      cVar5 = (xfA->m_basis).m_el[0].m_floats[2];
      cVar6 = (xfA->m_basis).m_el[1].m_floats[0];
      fVar7 = (xfA->m_basis).m_el[1].m_floats[1];
      cVar8 = (xfA->m_basis).m_el[1].m_floats[2];
      cVar9 = (xfA->m_basis).m_el[2].m_floats[0];
      fVar10 = (xfA->m_basis).m_el[2].m_floats[1];
      cVar11 = (xfA->m_basis).m_el[2].m_floats[2];
      uVar33 = (ulong)*piVar30;
      fVar12 = (pcVar29->m_basis).m_el[1].m_floats[1];
      cVar13 = (pcVar29->m_basis).m_el[1].m_floats[0];
      fVar14 = (pcVar29->m_basis).m_el[0].m_floats[1];
      fVar15 = (pcVar29->m_basis).m_el[2].m_floats[1];
      cVar16 = (pcVar29->m_basis).m_el[0].m_floats[0];
      cVar17 = (pcVar29->m_basis).m_el[2].m_floats[0];
      cVar18 = (pcVar29->m_basis).m_el[1].m_floats[2];
      cVar19 = (pcVar29->m_basis).m_el[0].m_floats[2];
      cVar20 = (pcVar29->m_basis).m_el[2].m_floats[2];
      fVar21 = (pcVar29->m_origin).m_floats[2];
      fVar22 = (pcVar29->m_origin).m_floats[1];
      fVar23 = (pcVar29->m_origin).m_floats[0];
      pcVar36 = polyA->m_normals[0].m_floats + 2;
      bVar41 = (long)(uVar33 << 3) < 0;
      bVar42 = (uVar33 & 0xfffffffffffffff) == 0;
      cVar24 = pcVar39->m_normals[uVar33].m_floats[1];
      cVar25 = pcVar39->m_normals[uVar33].m_floats[0];
      cVar26 = pcVar39->m_normals[uVar33].m_floats[2];
      auVar43 = vmulss_avx512f(ZEXT416((uint)fVar12),ZEXT416((uint)cVar24));
      auVar44 = vmulss_avx512f(ZEXT416((uint)fVar14),ZEXT416((uint)cVar24));
      auVar45 = vmulss_avx512f(ZEXT416((uint)fVar15),ZEXT416((uint)cVar24));
      auVar43 = vfmadd231ss_avx512f(auVar43,ZEXT416((uint)cVar13),ZEXT416((uint)cVar25));
      auVar44 = vfmadd231ss_avx512f(auVar44,ZEXT416((uint)cVar16),ZEXT416((uint)cVar25));
      auVar45 = vfmadd231ss_avx512f(auVar45,ZEXT416((uint)cVar17),ZEXT416((uint)cVar25));
      auVar43 = vfmadd231ss_avx512f(auVar43,ZEXT416((uint)cVar18),ZEXT416((uint)cVar26));
      auVar46 = vfmadd231ss_avx512f(auVar44,ZEXT416((uint)cVar19),ZEXT416((uint)cVar26));
      auVar47 = vfmadd231ss_avx512f(auVar45,ZEXT416((uint)cVar20),ZEXT416((uint)cVar26));
      auVar44 = vmulss_avx512f(ZEXT416((uint)cVar6),auVar43);
      auVar45 = vmulss_avx512f(ZEXT416((uint)fVar7),auVar43);
      auVar48 = vmulss_avx512f(ZEXT416((uint)cVar8),auVar43);
      auVar43 = vfmadd231ss_fma(auVar44,ZEXT416((uint)cVar49),auVar46);
      auVar44 = vfmadd231ss_fma(auVar45,ZEXT416((uint)fVar4),auVar46);
      auVar45 = vfmadd231ss_fma(auVar48,ZEXT416((uint)cVar5),auVar46);
      auVar43 = vfmadd231ss_avx512f(auVar43,ZEXT416((uint)cVar9),auVar47);
      auVar44 = vfmadd231ss_avx512f(auVar44,ZEXT416((uint)fVar10),auVar47);
      auVar45 = vfmadd231ss_avx512f(auVar45,ZEXT416((uint)cVar11),auVar47);
      do {
        auVar46 = vmulss_avx512f(auVar44,ZEXT416((uint)pcVar36[-1]));
        auVar46 = vfmadd231ss_avx512f(auVar46,auVar43,
                                      ZEXT416((uint)((cbtVector3 *)(pcVar36 + -2))->m_floats[0]));
        auVar47 = vfmadd231ss_avx512f(auVar46,auVar45,ZEXT416((uint)*pcVar36));
        auVar46 = vucomiss_avx512f(auVar47);
        vminss_avx512f(auVar47,auVar46);
        if (!bVar41 && !bVar42) {
          uVar34 = uVar37 & 0xffffffff;
        }
        uVar37 = uVar37 + 1;
        pcVar36 = pcVar36 + 4;
        bVar41 = uVar37 < 4;
        bVar42 = uVar37 == 4;
      } while (!bVar42);
      iVar32 = (int)uVar34;
      iVar35 = 0;
      if (iVar32 < 3) {
        iVar35 = iVar32 + 1;
      }
      fVar27 = polyA->m_vertices[iVar32].m_floats[1];
      cVar24 = polyA->m_vertices[iVar32].m_floats[0];
      cVar25 = polyA->m_vertices[iVar32].m_floats[2];
      auVar44 = vmulss_avx512f(ZEXT416((uint)fVar7),ZEXT416((uint)fVar27));
      auVar43 = vfmadd231ss_fma(ZEXT416((uint)(fVar4 * fVar27)),ZEXT416((uint)cVar24),
                                ZEXT416((uint)cVar49));
      auVar45 = vfmadd231ss_avx512f(auVar44,ZEXT416((uint)cVar24),ZEXT416((uint)cVar6));
      auVar44 = vfmadd231ss_fma(ZEXT416((uint)(fVar27 * fVar10)),ZEXT416((uint)cVar9),
                                ZEXT416((uint)cVar24));
      auVar43 = vfmadd231ss_fma(auVar43,ZEXT416((uint)cVar25),ZEXT416((uint)cVar5));
      auVar45 = vfmadd231ss_avx512f(auVar45,ZEXT416((uint)cVar25),ZEXT416((uint)cVar8));
      auVar44 = vfmadd231ss_fma(auVar44,ZEXT416((uint)cVar11),ZEXT416((uint)cVar25));
      auVar45 = vaddss_avx512f(ZEXT416((uint)fVar56),auVar45);
      auVar43 = vinsertps_avx(ZEXT416((uint)(auVar43._0_4_ + fVar3)),auVar45,0x10);
      local_58.v.m_floats =
           (cbtScalar  [4])vinsertps_avx(auVar43,ZEXT416((uint)(auVar44._0_4_ + fVar2)),0x28);
      fVar27 = polyA->m_vertices[iVar35].m_floats[1];
      cVar24 = polyA->m_vertices[iVar35].m_floats[0];
      auVar43 = vfmadd231ss_fma(ZEXT416((uint)(fVar4 * fVar27)),ZEXT416((uint)cVar24),
                                ZEXT416((uint)cVar49));
      cVar49 = polyA->m_vertices[iVar35].m_floats[2];
      pcVar1 = pcVar39->m_vertices + uVar33 + 1;
      pcVar40 = pcVar39->m_vertices;
      if (*piVar30 < 3) {
        pcVar40 = pcVar1;
      }
      auVar43 = vfmadd231ss_fma(auVar43,ZEXT416((uint)cVar49),ZEXT416((uint)cVar5));
      auVar44 = vfmadd231ss_fma(ZEXT416((uint)(fVar7 * fVar27)),ZEXT416((uint)cVar24),
                                ZEXT416((uint)cVar6));
      auVar45 = vfmadd231ss_fma(ZEXT416((uint)(fVar27 * fVar10)),ZEXT416((uint)cVar24),
                                ZEXT416((uint)cVar9));
      auVar44 = vfmadd231ss_fma(auVar44,ZEXT416((uint)cVar49),ZEXT416((uint)cVar8));
      auVar45 = vfmadd231ss_fma(auVar45,ZEXT416((uint)cVar49),ZEXT416((uint)cVar11));
      auVar43 = vinsertps_avx(ZEXT416((uint)(auVar43._0_4_ + fVar3)),
                              ZEXT416((uint)(auVar44._0_4_ + fVar56)),0x10);
      local_44 = vinsertps_avx(auVar43,ZEXT416((uint)(fVar2 + auVar45._0_4_)),0x28);
      local_c8._8_8_ = 0;
      local_c8._0_8_ = *(ulong *)pcVar40->m_floats;
      auVar51._8_8_ = 0;
      auVar51._0_8_ = *(ulong *)pcVar1[-1].m_floats;
      uVar33 = *(ulong *)(pcVar40->m_floats + 2);
      local_d8 = vmovshdup_avx(local_c8);
      auVar43 = vmovshdup_avx(auVar51);
      fVar2 = (float)*(ulong *)pcVar40->m_floats - (float)*(ulong *)pcVar1[-1].m_floats;
      local_138[2] = 0.0;
      local_138[3] = 0.0;
      local_138[0] = (cbtScalar)(int)uVar33;
      local_138[1] = (cbtScalar)(int)(uVar33 >> 0x20);
      fVar56 = (float)uVar33 - pcVar1[-1].m_floats[2];
      fVar3 = local_d8._0_4_ - auVar43._0_4_;
      auVar44 = vmulss_avx512f(ZEXT416((uint)fVar12),auVar43);
      auVar45 = vmulss_avx512f(ZEXT416((uint)fVar14),ZEXT416((uint)fVar3));
      auVar46 = vmulss_avx512f(ZEXT416((uint)fVar12),ZEXT416((uint)fVar3));
      auVar47 = vmulss_avx512f(ZEXT416((uint)fVar15),ZEXT416((uint)fVar3));
      auVar44 = vfmadd231ss_avx512f(auVar44,auVar51,ZEXT416((uint)cVar13));
      auVar47 = vfmadd231ss_avx512f(auVar47,ZEXT416((uint)cVar17),ZEXT416((uint)fVar2));
      auVar46 = vfmadd231ss_avx512f(auVar46,ZEXT416((uint)cVar13),ZEXT416((uint)fVar2));
      auVar45 = vfmadd231ss_avx512f(auVar45,ZEXT416((uint)cVar16),ZEXT416((uint)fVar2));
      auVar53 = ZEXT416((uint)pcVar1[-1].m_floats[2]);
      auVar48 = vfmadd231ss_avx512f(auVar44,auVar53,ZEXT416((uint)cVar18));
      local_88.v.m_floats[0] = 0.0;
      local_88.v.m_floats[1] = 0.0;
      local_88.v.m_floats[2] = 0.0;
      local_88.v.m_floats[3] = 0.0;
      local_b8.v.m_floats[0] = 0.0;
      local_b8.v.m_floats[1] = 0.0;
      local_b8.v.m_floats[2] = 0.0;
      local_b8.v.m_floats[3] = 0.0;
      local_74 = 0;
      uStack_6c = 0;
      local_a4 = 0;
      uStack_9c = 0;
      auVar47 = vfmadd231ss_avx512f(auVar47,ZEXT416((uint)cVar20),ZEXT416((uint)fVar56));
      auVar44 = vfmadd231ss_avx512f(auVar46,ZEXT416((uint)cVar18),ZEXT416((uint)fVar56));
      auVar45 = vfmadd231ss_avx512f(auVar45,ZEXT416((uint)cVar19),ZEXT416((uint)fVar56));
      uVar28 = vmovlps_avx(ZEXT416((uint)auVar47._0_4_));
      local_148.m_floats[1] = auVar44._0_4_;
      auVar44 = vfmadd231ss_fma(ZEXT416((uint)(local_148.m_floats[1] * local_148.m_floats[1])),
                                auVar45,auVar45);
      auVar44 = vfmadd231ss_fma(auVar44,auVar47,auVar47);
      auVar44 = vsqrtss_avx(auVar44,auVar44);
      fVar56 = 1.0 / auVar44._0_4_;
      local_148.m_floats[2] = auVar47._0_4_ * fVar56;
      auVar44 = vmulss_avx512f(ZEXT416((uint)fVar14),auVar43);
      auVar43 = vmulss_avx512f(ZEXT416((uint)fVar15),auVar43);
      fVar2 = auVar45._0_4_ * fVar56;
      local_148.m_floats[1] = local_148.m_floats[1] * fVar56;
      auVar44 = vfmadd231ss_avx512f(auVar44,auVar51,ZEXT416((uint)cVar16));
      auVar43 = vfmadd231ss_avx512f(auVar43,ZEXT416((uint)cVar17),auVar51);
      auVar45 = vaddss_avx512f(ZEXT416((uint)fVar22),auVar48);
      local_128 = ZEXT416((uint)local_148.m_floats[1]);
      local_148.m_floats[3] = (cbtScalar)((ulong)uVar28 >> 0x20);
      local_e8 = ZEXT416((uint)local_148.m_floats[2]);
      auVar44 = vfmadd231ss_avx512f(auVar44,auVar53,ZEXT416((uint)cVar19));
      auVar43 = vfmadd231ss_avx512f(auVar43,ZEXT416((uint)cVar20),auVar53);
      auVar46 = vaddss_avx512f(ZEXT416((uint)fVar23),auVar44);
      auVar47 = vaddss_avx512f(ZEXT416((uint)fVar21),auVar43);
      auVar53._0_4_ = -fVar2;
      auVar53._4_4_ = 0x80000000;
      auVar53._8_4_ = 0x80000000;
      auVar53._12_4_ = 0x80000000;
      local_f8._0_8_ = CONCAT44(0x80000000,local_148.m_floats[1]) ^ 0x80000000;
      local_f8._8_4_ = 0x80000000;
      local_f8._12_4_ = 0x80000000;
      auVar43 = vunpcklps_avx(auVar53,local_f8);
      auVar44 = vfmadd231ss_fma(ZEXT416((uint)(local_148.m_floats[1] * auVar45._0_4_)),
                                ZEXT416((uint)fVar2),auVar46);
      auVar48._0_4_ = -local_148.m_floats[2];
      auVar48._4_4_ = 0x80000000;
      auVar48._8_4_ = 0x80000000;
      auVar48._12_4_ = 0x80000000;
      local_108.m_floats = (cbtScalar  [4])vinsertps_avx(auVar43,auVar48,0x28);
      auVar43 = vfmadd231ss_fma(auVar44,local_e8,auVar47);
      local_148.m_floats[0] = fVar2;
      iVar32 = ClipSegmentToLine(&local_88,&local_58,&local_108,-auVar43._0_4_);
      pcVar31 = local_118;
      if (1 < iVar32) {
        vOut = &local_b8;
        auVar43 = vfmadd213ss_fma(ZEXT416((uint)cVar17),local_c8,
                                  ZEXT416((uint)((float)local_d8._0_4_ * fVar15)));
        auVar43 = vfmadd213ss_fma(ZEXT416((uint)cVar20),(undefined1  [16])local_138,auVar43);
        auVar44 = vfmadd213ss_fma(ZEXT416((uint)cVar16),local_c8,
                                  ZEXT416((uint)((float)local_d8._0_4_ * fVar14)));
        auVar44 = vfmadd213ss_fma(ZEXT416((uint)cVar19),(undefined1  [16])local_138,auVar44);
        auVar48 = vfmadd213ss_fma(ZEXT416((uint)cVar13),local_c8,
                                  ZEXT416((uint)((float)local_d8._0_4_ * fVar12)));
        auVar48 = vfmadd213ss_fma(ZEXT416((uint)cVar18),(undefined1  [16])local_138,auVar48);
        auVar44 = vfmadd231ss_fma(ZEXT416((uint)((auVar48._0_4_ + fVar22) * (float)local_128._0_4_))
                                  ,ZEXT416((uint)(auVar44._0_4_ + fVar23)),ZEXT416((uint)fVar2));
        auVar43 = vfmadd231ss_fma(auVar44,ZEXT416((uint)(auVar43._0_4_ + fVar21)),
                                  ZEXT416((uint)local_e8._0_4_));
        iVar32 = ClipSegmentToLine(vOut,&local_88,&local_148,auVar43._0_4_);
        auVar55 = ZEXT1664(local_128);
        if ((1 < iVar32) && (0 < b2_maxManifoldPoints)) {
          auVar43 = vfmsub213ss_fma(ZEXT416(auVar46._0_4_),local_128,
                                    ZEXT416((uint)(fVar2 * auVar45._0_4_)));
          if (cVar50 <= fVar52) {
            auVar44 = vinsertps_avx(local_128,ZEXT416((uint)auVar53._0_4_),0x10);
          }
          else {
            auVar44 = vinsertps_avx(local_f8,ZEXT416((uint)fVar2),0x10);
          }
          uVar28 = vcmpss_avx512f(ZEXT416((uint)fVar52),ZEXT416((uint)cVar50),5);
          auVar43 = vfmadd132ss_fma(ZEXT816(0) << 0x40,auVar43,ZEXT416(auVar47._0_4_));
          auVar57 = ZEXT1664(auVar43);
          auVar45._8_4_ = 0x80000000;
          auVar45._0_8_ = 0x8000000080000000;
          auVar45._12_4_ = 0x80000000;
          auVar45 = vxorps_avx512vl(auVar44,auVar45);
          auVar44._8_8_ = 0;
          auVar44._0_8_ = SUB648(ZEXT6064((undefined1  [60])0x0),4);
          lVar38 = 0;
          auVar46._4_12_ = SUB1612(auVar44 << 0x40,4);
          auVar46._0_4_ = (uint)((byte)uVar28 & 1) * -0x80000000;
          local_138 = (cbtScalar  [4])vmovlhps_avx(auVar45,auVar46);
          auVar54 = ZEXT464(0) << 0x20;
          iVar32 = b2_maxManifoldPoints;
          do {
            auVar44 = vfmadd231ss_fma(ZEXT416((uint)(auVar53._0_4_ * (vOut->v).m_floats[1])),
                                      auVar55._0_16_,ZEXT416((uint)(vOut->v).m_floats[0]));
            auVar44 = vfmadd231ss_fma(auVar44,auVar54._0_16_,ZEXT416((uint)(vOut->v).m_floats[2]));
            if (auVar44._0_4_ - auVar57._0_4_ <= 0.0) {
              local_108.m_floats[0] = local_138[0];
              local_108.m_floats[1] = local_138[1];
              local_108.m_floats[2] = local_138[2];
              local_108.m_floats[3] = local_138[3];
              (*(pcVar31->super_Result)._vptr_Result[4])(pcVar31,&local_108,vOut);
              auVar57 = ZEXT464(auVar43._0_4_);
              auVar55 = ZEXT1664(local_128);
              auVar54 = ZEXT1664(ZEXT816(0) << 0x40);
              iVar32 = b2_maxManifoldPoints;
            }
            lVar38 = lVar38 + 1;
            vOut = vOut + 1;
          } while (lVar38 < iVar32);
        }
      }
    }
  }
  return;
}

Assistant:

void b2CollidePolygons(cbtManifoldResult* manifold,
					   const cbtBox2dShape* polyA, const cbtTransform& xfA,
					   const cbtBox2dShape* polyB, const cbtTransform& xfB)
{
	int edgeA = 0;
	cbtScalar separationA = FindMaxSeparation(&edgeA, polyA, xfA, polyB, xfB);
	if (separationA > 0.0f)
		return;

	int edgeB = 0;
	cbtScalar separationB = FindMaxSeparation(&edgeB, polyB, xfB, polyA, xfA);
	if (separationB > 0.0f)
		return;

	const cbtBox2dShape* poly1;  // reference poly
	const cbtBox2dShape* poly2;  // incident poly
	cbtTransform xf1, xf2;
	int edge1;  // reference edge
	unsigned char flip;
	const cbtScalar k_relativeTol = 0.98f;
	const cbtScalar k_absoluteTol = 0.001f;

	// TODO_ERIN use "radius" of poly for absolute tolerance.
	if (separationB > k_relativeTol * separationA + k_absoluteTol)
	{
		poly1 = polyB;
		poly2 = polyA;
		xf1 = xfB;
		xf2 = xfA;
		edge1 = edgeB;
		flip = 1;
	}
	else
	{
		poly1 = polyA;
		poly2 = polyB;
		xf1 = xfA;
		xf2 = xfB;
		edge1 = edgeA;
		flip = 0;
	}

	ClipVertex incidentEdge[2];
	FindIncidentEdge(incidentEdge, poly1, xf1, edge1, poly2, xf2);

	int count1 = poly1->getVertexCount();
	const cbtVector3* vertices1 = poly1->getVertices();

	cbtVector3 v11 = vertices1[edge1];
	cbtVector3 v12 = edge1 + 1 < count1 ? vertices1[edge1 + 1] : vertices1[0];

	//cbtVector3 dv = v12 - v11;
	cbtVector3 sideNormal = b2Mul(xf1.getBasis(), v12 - v11);
	sideNormal.normalize();
	cbtVector3 frontNormal = cbtCrossS(sideNormal, 1.0f);

	v11 = b2Mul(xf1, v11);
	v12 = b2Mul(xf1, v12);

	cbtScalar frontOffset = b2Dot(frontNormal, v11);
	cbtScalar sideOffset1 = -b2Dot(sideNormal, v11);
	cbtScalar sideOffset2 = b2Dot(sideNormal, v12);

	// Clip incident edge against extruded edge1 side edges.
	ClipVertex clipPoints1[2];
	clipPoints1[0].v.setValue(0, 0, 0);
	clipPoints1[1].v.setValue(0, 0, 0);

	ClipVertex clipPoints2[2];
	clipPoints2[0].v.setValue(0, 0, 0);
	clipPoints2[1].v.setValue(0, 0, 0);

	int np;

	// Clip to box side 1
	np = ClipSegmentToLine(clipPoints1, incidentEdge, -sideNormal, sideOffset1);

	if (np < 2)
		return;

	// Clip to negative box side 1
	np = ClipSegmentToLine(clipPoints2, clipPoints1, sideNormal, sideOffset2);

	if (np < 2)
	{
		return;
	}

	// Now clipPoints2 contains the clipped points.
	cbtVector3 manifoldNormal = flip ? -frontNormal : frontNormal;

	int pointCount = 0;
	for (int i = 0; i < b2_maxManifoldPoints; ++i)
	{
		cbtScalar separation = b2Dot(frontNormal, clipPoints2[i].v) - frontOffset;

		if (separation <= 0.0f)
		{
			//b2ManifoldPoint* cp = manifold->points + pointCount;
			//cbtScalar separation = separation;
			//cp->localPoint1 = b2MulT(xfA, clipPoints2[i].v);
			//cp->localPoint2 = b2MulT(xfB, clipPoints2[i].v);

			manifold->addContactPoint(-manifoldNormal, clipPoints2[i].v, separation);

			//			cp->id = clipPoints2[i].id;
			//			cp->id.features.flip = flip;
			++pointCount;
		}
	}

	//	manifold->pointCount = pointCount;}
}